

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseStorage.h
# Opt level: O1

void __thiscall
Eigen::DenseStorage<int,_-1,_-1,_1,_0>::resize
          (DenseStorage<int,__1,__1,_1,_0> *this,Index size,Index rows,Index param_3)

{
  int *piVar1;
  undefined8 *puVar2;
  
  if (this->m_rows != size) {
    free(this->m_data);
    if (size < 1) {
      piVar1 = (int *)0x0;
    }
    else {
      if ((ulong)size >> 0x3e != 0) {
LAB_00172998:
        puVar2 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar2 = boost::program_options::detail::cmdline::cmdline;
        __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      piVar1 = (int *)malloc(size * 4);
      if (3 < (ulong)size && ((ulong)piVar1 & 0xf) != 0) {
        __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/util/Memory.h"
                      ,0xb9,"void *Eigen::internal::aligned_malloc(std::size_t)");
      }
      if (piVar1 == (int *)0x0) goto LAB_00172998;
    }
    this->m_data = piVar1;
  }
  this->m_rows = rows;
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void resize(Index size, Index rows, Index)
    {
      if(size != m_rows*_Cols)
      {
        internal::conditional_aligned_delete_auto<T,(_Options&DontAlign)==0>(m_data, _Cols*m_rows);
        if (size>0) // >0 and not simply !=0 to let the compiler knows that size cannot be negative
          m_data = internal::conditional_aligned_new_auto<T,(_Options&DontAlign)==0>(size);
        else
          m_data = 0;
        EIGEN_INTERNAL_DENSE_STORAGE_CTOR_PLUGIN({})
      }
      m_rows = rows;
    }